

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O0

void __thiscall index_tree::create_index_tree(index_tree *this)

{
  shared_ptr<index> idx;
  int i;
  shared_ptr<index> *in_stack_ffffffffffffffc8;
  vector<std::shared_ptr<index>,_std::allocator<std::shared_ptr<index>_>_>
  *in_stack_ffffffffffffffd0;
  index_tree **in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  undefined4 local_c;
  
  for (local_c = 1; local_c < 0x15; local_c = local_c + 1) {
    std::make_shared<index,int&,index_tree*>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::vector<std::shared_ptr<index>,std::allocator<std::shared_ptr<index>>>::
    emplace_back<std::shared_ptr<index>&>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::shared_ptr<index>::~shared_ptr((shared_ptr<index> *)0x11957e);
  }
  return;
}

Assistant:

void index_tree::create_index_tree()
{
	for (int i = 1; i <= max_index_level; ++i)
	{
		auto idx = std::make_shared<index>(i, this);
		indexes_.emplace_back(idx);
	}
}